

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::IGXMLScanner::normalizeAttValue
          (IGXMLScanner *this,XMLAttDef *attDef,XMLCh *attName,XMLCh *value,XMLBuffer *toFill)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  XMLReader *pXVar5;
  XMLCh *pXVar6;
  bool bVar7;
  AttTypes local_54;
  bool firstNonWS;
  XMLCh *pXStack_40;
  States curState;
  XMLCh *srcPtr;
  XMLCh nextCh;
  bool retVal;
  bool isAttTokenizedExternal;
  AttTypes type;
  XMLBuffer *toFill_local;
  XMLCh *value_local;
  XMLCh *attName_local;
  XMLAttDef *attDef_local;
  IGXMLScanner *this_local;
  
  if (attDef == (XMLAttDef *)0x0) {
    local_54 = AttTypes_Min;
    bVar7 = false;
  }
  else {
    local_54 = XMLAttDef::getType(attDef);
    bVar2 = XMLAttDef::isExternal(attDef);
    bVar7 = false;
    if ((((bVar2) && (bVar7 = true, local_54 != ID)) && (bVar7 = true, local_54 != IDRef)) &&
       (((bVar7 = true, local_54 != IDRefs && (bVar7 = true, local_54 != Entity)) &&
        ((bVar7 = true, local_54 != Entities && (bVar7 = true, local_54 != NmToken)))))) {
      bVar7 = local_54 == NmTokens;
    }
  }
  srcPtr._2_1_ = true;
  XMLBuffer::reset(toFill);
  pXStack_40 = value;
  if ((local_54 == AttTypes_Min) || (Notation < local_54)) {
    while( true ) {
      pXVar6 = pXStack_40 + 1;
      srcPtr._0_2_ = *pXStack_40;
      if ((XMLCh)srcPtr == L'\0') break;
      uVar4 = (uint)(ushort)(XMLCh)srcPtr;
      if ((uVar4 - 9 < 2) || (uVar4 == 0xd)) {
        if ((((this->super_XMLScanner).fStandalone & 1U) != 0) &&
           ((((this->super_XMLScanner).fValidate & 1U) != 0 && (bVar7)))) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0
                     ,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        srcPtr._0_2_ = L' ';
      }
      else if (uVar4 == 0x3c) {
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        srcPtr._2_1_ = false;
      }
      else if (uVar4 == 0xffff) {
        srcPtr._0_2_ = *pXVar6;
        pXVar6 = pXStack_40 + 2;
      }
      pXStack_40 = pXVar6;
      XMLBuffer::append(toFill,(XMLCh)srcPtr);
    }
  }
  else {
    bVar2 = true;
    bVar1 = false;
LAB_0035a8bc:
    srcPtr._0_2_ = *pXStack_40;
    if ((XMLCh)srcPtr != L'\0') {
      if ((XMLCh)srcPtr == L'\xffff') {
        srcPtr._0_2_ = pXStack_40[1];
        pXStack_40 = pXStack_40 + 1;
      }
      else if ((XMLCh)srcPtr == L'<') {
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        srcPtr._2_1_ = false;
      }
      if (!bVar2) {
        pXVar5 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar3 = XMLReader::isWhitespace(pXVar5,(XMLCh)srcPtr);
        if (bVar3) {
          pXStack_40 = pXStack_40 + 1;
        }
        else {
          if (bVar1) {
            XMLBuffer::append(toFill,L' ');
          }
          bVar2 = true;
          bVar1 = true;
LAB_0035aa4b:
          XMLBuffer::append(toFill,(XMLCh)srcPtr);
          pXStack_40 = pXStack_40 + 1;
        }
        goto LAB_0035a8bc;
      }
      if (!bVar2) goto LAB_0035aa4b;
      pXVar5 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar3 = XMLReader::isWhitespace(pXVar5,(XMLCh)srcPtr);
      if (!bVar3) {
        bVar1 = true;
        goto LAB_0035aa4b;
      }
      bVar2 = false;
      pXStack_40 = pXStack_40 + 1;
      if (((((this->super_XMLScanner).fStandalone & 1U) == 0) ||
          (((this->super_XMLScanner).fValidate & 1U) == 0)) || (!bVar7)) goto LAB_0035a8bc;
      if (bVar1) {
        if (((XMLCh)srcPtr == L' ') || (*pXStack_40 == L'\0')) goto LAB_0035a8bc;
        pXVar5 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar3 = XMLReader::isWhitespace(pXVar5,*pXStack_40);
        if (!bVar3) goto LAB_0035a8bc;
      }
      XMLValidator::emitError
                ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_0035a8bc;
    }
  }
  return srcPtr._2_1_;
}

Assistant:

bool IGXMLScanner::normalizeAttValue( const   XMLAttDef* const    attDef
                                      , const XMLCh* const        attName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // A simple state value for a whitespace processing state machine
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)?attDef->getType():XMLAttDef::CData;

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    XMLCh nextCh;
    const XMLCh* srcPtr = value;

    if (type == XMLAttDef::CData || type > XMLAttDef::Notation) {
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        while ((nextCh = *srcPtr++)!=0)
        {
            switch(nextCh)
            {
            // Do we have an escaped character ?
            case 0xFFFF:
                nextCh = *srcPtr++;
                break;
            case 0x09:
            case 0x0A:
            case 0x0D:
                // Check Validity Constraint for Standalone document declaration
                // XML 1.0, Section 2.9
                if (fStandalone && fValidate && isAttTokenizedExternal)
                {
                     // Can't have a standalone document declaration of "yes" if  attribute
                     // values are subject to normalisation
                     fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                }
                nextCh = chSpace;
                break;
            case chOpenAngle:
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
                break;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);
        }
    }
    else {
        States curState = InContent;
        bool firstNonWS = false;
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        while ((nextCh = *srcPtr)!=0)
        {
            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            if (curState == InWhitespace)
            {
                if (!fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    if (firstNonWS)
                        toFill.append(chSpace);
                    curState = InContent;
                    firstNonWS = true;
                }
                else
                {
                    srcPtr++;
                    continue;
                }
            }
            else if (curState == InContent)
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    curState = InWhitespace;
                    srcPtr++;

                    // Check Validity Constraint for Standalone document declaration
                    // XML 1.0, Section 2.9
                    if (fStandalone && fValidate && isAttTokenizedExternal)
                    {
                        if (!firstNonWS || (nextCh != chSpace && *srcPtr && fReaderMgr.getCurrentReader()->isWhitespace(*srcPtr)))
                        {
                            // Can't have a standalone document declaration of "yes" if  attribute
                            // values are subject to normalisation
                            fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                        }
                    }
                    continue;
                }
                firstNonWS = true;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }

    return retVal;
}